

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char **ppcVar6;
  long lVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  uint __c;
  
  if ((prev_argv != ___argv) || (prev_argc != ___argc)) {
    argv_index = 1;
    argv_index2 = 1;
    opt_offset = 1;
    dashdash = 0;
    nonopt = 0;
    prev_argv = ___argv;
    prev_argc = ___argc;
  }
  ppcVar6 = prev_argv;
  optarg = (char *)0x0;
  lVar7 = (long)argv_index;
  pcVar3 = ___argv[lVar7];
  iVar10 = nonopt;
  if (pcVar3 != (char *)0x0) {
    uVar8 = argv_index;
    bVar9 = dashdash;
    do {
      iVar10 = nonopt;
      optarg = (char *)0x0;
      if (((*pcVar3 == '-') && (pcVar3[1] == '-')) && (pcVar3[2] == '\0')) {
        dashdash = 1;
        increment_index();
        lVar7 = (long)argv_index;
        pcVar3 = ___argv[lVar7];
        bVar9 = 1;
        uVar8 = argv_index;
        if (pcVar3 == (char *)0x0) break;
      }
      else if ((bVar9 & 1) == 0) {
        if ((*pcVar3 == '-') && (pcVar3[1] != '\0')) {
          lVar4 = (long)opt_offset;
          lVar7 = lVar4 + 1;
          opt_offset = (int)lVar7;
          cVar1 = pcVar3[lVar4];
          __c = (uint)cVar1;
          pcVar5 = strchr(__shortopts + (*__shortopts == '-'),__c);
          if (pcVar5 == (char *)0x0) {
            if (opterr != 0) {
              fprintf(_stderr,"%s: invalid option -- %c\n",*___argv,(ulong)__c);
            }
            optopt = __c;
            increment_index();
            optind = argv_index;
            return 0x3f;
          }
          if (pcVar5[1] != ':') {
            if (pcVar3[lVar7] == '\0') {
              increment_index();
            }
            goto LAB_001070bb;
          }
          if (pcVar3[lVar7] != '\0') {
            optarg = pcVar3 + lVar7;
            goto LAB_001070a2;
          }
          if (pcVar5[2] == ':') goto LAB_001070a2;
          if ((int)uVar8 < argv_index2) {
            uVar8 = argv_index2;
          }
          ppcVar6 = ___argv + (int)uVar8;
          goto LAB_00107071;
        }
        bVar9 = 0;
      }
      else {
        bVar9 = 1;
      }
      if (*__shortopts == '+') {
LAB_00106f85:
        iVar10 = ___argc - uVar8;
        nonopt = iVar10;
        break;
      }
      if (*__shortopts == '-') {
        optarg = pcVar3;
        increment_index();
        optind = argv_index;
        return 1;
      }
      pcVar3 = getenv("POSIXLY_CORRECT");
      if (pcVar3 != (char *)0x0) goto LAB_00106f85;
      if (___argc <= (int)(iVar10 + uVar8)) break;
      pcVar3 = ppcVar6[lVar7];
      memmove(ppcVar6 + lVar7,ppcVar6 + lVar7 + 1,(long)(int)(~uVar8 + ___argc) << 3);
      ppcVar6[(long)___argc + -1] = pcVar3;
      iVar10 = iVar10 + 1;
      optarg = (char *)0x0;
      lVar7 = (long)(int)uVar8;
      pcVar3 = ___argv[lVar7];
      nonopt = iVar10;
    } while (pcVar3 != (char *)0x0);
  }
  optind = ___argc - iVar10;
  return -1;
  while (*pcVar3 == '-') {
LAB_00107071:
    uVar8 = uVar8 + 1;
    ppcVar6 = ppcVar6 + 1;
    pcVar3 = *ppcVar6;
    if (pcVar3 == (char *)0x0) break;
  }
  optarg = (char *)0x0;
  argv_index2 = uVar8;
  if ((int)(uVar8 + iVar10) < ___argc) {
    optarg = pcVar3;
  }
LAB_001070a2:
  increment_index();
  if ((optarg == (char *)0x0) && (pcVar5[2] != ':')) {
    uVar8 = 0x3f;
    iVar2 = argv_index;
    optopt = __c;
    if (opterr != 0) {
      fprintf(_stderr,"%s: option requires an argument -- %c\n",*___argv,(ulong)__c);
      iVar2 = argv_index;
    }
  }
  else {
LAB_001070bb:
    iVar2 = argv_index;
    uVar8 = __c;
    if (cVar1 == -1) {
      iVar2 = ___argc - iVar10;
    }
  }
  optind = iVar2;
  return uVar8;
}

Assistant:

int getopt(int argc, char** argv, const char* optstr)
{
	int c = 0;

	/* If we have new argv, reinitialize */
	if(prev_argv != argv || prev_argc != argc)
	{
		/* Initialize variables */
		prev_argv = argv;
		prev_argc = argc;
		argv_index = 1;
		argv_index2 = 1;
		opt_offset = 1;
		dashdash = 0;
		nonopt = 0;
	}

	/* Jump point in case we want to ignore the current argv_index */
	getopt_top:

	/* Misc. initializations */
	optarg = NULL;

	/* Dash-dash check */
	if(argv[argv_index] && !strcmp(argv[argv_index], "--"))
	{
		dashdash = 1;
		increment_index();
	}

	/* If we're at the end of argv, that's it. */
	if(argv[argv_index] == NULL)
	{
		c = -1;
	}
	/* Are we looking at a string? Single dash is also a string */
	else if(dashdash || argv[argv_index][0] != '-' || !strcmp(argv[argv_index], "-"))
	{
		/* If we want a string... */
		if(optstr[0] == '-')
		{
			c = 1;
			optarg = argv[argv_index];
			increment_index();
		}
		/* If we really don't want it (we're in POSIX mode), we're done */
		else if(optstr[0] == '+' || getenv("POSIXLY_CORRECT"))
		{
			c = -1;

			/* Everything else is a non-opt argument */
			nonopt = argc - argv_index;
		}
		/* If we mildly don't want it, then move it back */
		else
		{
			if(!permute_argv_once()) goto getopt_top;
			else c = -1;
		}
	}
	/* Otherwise we're looking at an option */
	else
	{
		char* opt_ptr = NULL;

		/* Grab the option */
		c = argv[argv_index][opt_offset++];

		/* Is the option in the optstr? */
		if(optstr[0] == '-') opt_ptr = strchr(optstr+1, c);
		else opt_ptr = strchr(optstr, c);
		/* Invalid argument */
		if(!opt_ptr)
		{
			if(opterr)
			{
				fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);
			}

			optopt = c;
			c = '?';

			/* Move onto the next option */
			increment_index();
		}
		/* Option takes argument */
		else if(opt_ptr[1] == ':')
		{
			/* ie, -oARGUMENT, -xxxoARGUMENT, etc. */
			if(argv[argv_index][opt_offset] != '\0')
			{
				optarg = &argv[argv_index][opt_offset];
				increment_index();
			}
			/* ie, -o ARGUMENT (only if it's a required argument) */
			else if(opt_ptr[2] != ':')
			{
				/* One of those "you're not expected to understand this" moment */
				if(argv_index2 < argv_index) argv_index2 = argv_index;
				while(argv[++argv_index2] && argv[argv_index2][0] == '-');
				optarg = argv[argv_index2];

				/* Don't cross into the non-option argument list */
				if(argv_index2 + nonopt >= prev_argc) optarg = NULL;

				/* Move onto the next option */
				increment_index();
			}
			else
			{
				/* Move onto the next option */
				increment_index();
			}

			/* In case we got no argument for an option with required argument */
			if(optarg == NULL && opt_ptr[2] != ':')
			{
				optopt = c;
				c = '?';

				if(opterr)
				{
					fprintf(stderr,"%s: option requires an argument -- %c\n",
							argv[0], optopt);
				}
			}
		}
		/* Option does not take argument */
		else
		{
			/* Next argv_index */
			if(argv[argv_index][opt_offset] == '\0')
			{
				increment_index();
			}
		}
	}

	/* Calculate optind */
	if(c == -1)
	{
		optind = argc - nonopt;
	}
	else
	{
		optind = argv_index;
	}

	return c;
}